

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

pair<int,_int> anon_unknown.dwarf_144a9a::upload_image(GLenum target,string *path,bool flip)

{
  uint uVar1;
  uint uVar2;
  stbi_uc *__ptr;
  ostream *poVar3;
  undefined7 in_register_00000011;
  pair<int,_int> pVar4;
  char local_2d;
  uint local_2c;
  uint local_28;
  int num_channels;
  
  local_28 = 0xffffffff;
  local_2c = 0xffffffff;
  num_channels = -1;
  stbi__vertically_flip_on_load_global = (int)CONCAT71(in_register_00000011,flip);
  __ptr = stbi_load((path->_M_dataplus)._M_p,(int *)&local_28,(int *)&local_2c,&num_channels,4);
  uVar2 = local_28;
  uVar1 = local_2c;
  if (__ptr == (stbi_uc *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Could not load texture: ",0x1f);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_2d = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_2d,1);
    pVar4.first = -1;
    pVar4.second = -1;
  }
  else {
    (*gl3wProcs.ptr[0x1d2])(target,0,0x8058,(ulong)local_28,(ulong)local_2c,0,0x1908,0x1401,__ptr);
    free(__ptr);
    pVar4.second = uVar1;
    pVar4.first = uVar2;
  }
  return pVar4;
}

Assistant:

std::pair< int, int > upload_image( GLenum target, const std::string& path, bool flip = false ) {
    int width(-1), height(-1), num_channels(-1);
    stbi_set_flip_vertically_on_load( flip );
    unsigned char* data = stbi_load( path.c_str(), &width, &height, &num_channels, 4 );
    if( !data ) {
        cerr << "ERROR: Could not load texture: " << path << '\n';
        width = height = -1;
    } else {
        glTexImage2D( target, 0, GL_RGBA8, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data );
    }
    stbi_image_free( data );
    
    return std::make_pair( width, height );
}